

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_read_tile_header
                   (opj_j2k_t *p_j2k,OPJ_UINT32 *p_tile_index,OPJ_UINT32 *p_data_size,
                   OPJ_INT32 *p_tile_x0,OPJ_INT32 *p_tile_y0,OPJ_INT32 *p_tile_x1,
                   OPJ_INT32 *p_tile_y1,OPJ_UINT32 *p_nb_comps,OPJ_BOOL *p_go_on,
                   opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  byte *pbVar1;
  byte bVar2;
  OPJ_UINT32 tileno;
  uint uVar3;
  int iVar4;
  opj_codestream_index_t *poVar5;
  opj_tp_index_t *poVar6;
  void *__src;
  opj_tcd_tile_t *poVar7;
  opj_dec_memory_marker_handler_t *poVar8;
  uint uVar9;
  OPJ_BOOL OVar10;
  OPJ_UINT32 OVar11;
  OPJ_OFF_T OVar12;
  OPJ_SIZE_T OVar13;
  OPJ_SIZE_T OVar14;
  OPJ_BYTE *pOVar15;
  uint uVar16;
  OPJ_BYTE **ppOVar17;
  long lVar18;
  char *pcVar19;
  opj_tcp_t *poVar20;
  uint uVar21;
  opj_ppx *ptr;
  ulong uVar22;
  opj_dec_memory_marker_handler_t *e;
  opj_dec_memory_marker_handler_t *poVar23;
  bool bVar24;
  OPJ_UINT32 l_tile_no;
  OPJ_UINT32 l_current_marker_1;
  OPJ_BYTE l_header_data [10];
  OPJ_UINT32 local_94;
  uint local_90;
  uint local_8c;
  OPJ_UINT32 local_88;
  OPJ_UINT32 local_84;
  OPJ_UINT32 local_80;
  OPJ_UINT32 local_7c;
  OPJ_UINT32 local_78;
  OPJ_UINT32 local_74;
  OPJ_UINT32 *local_70;
  OPJ_UINT32 *local_68;
  OPJ_INT32 *local_60;
  OPJ_INT32 *local_58;
  OPJ_INT32 *local_50;
  OPJ_OFF_T local_48;
  OPJ_BYTE local_3a [10];
  
  local_94 = 0xff90;
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1eb4,
                  "OPJ_BOOL opj_j2k_read_tile_header(opj_j2k_t *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_UINT32 *, OPJ_BOOL *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1eb5,
                  "OPJ_BOOL opj_j2k_read_tile_header(opj_j2k_t *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_UINT32 *, OPJ_BOOL *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1eb6,
                  "OPJ_BOOL opj_j2k_read_tile_header(opj_j2k_t *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_UINT32 *, OPJ_BOOL *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  OVar11 = (p_j2k->m_specific_param).m_decoder.m_state;
  local_70 = p_tile_index;
  local_68 = p_data_size;
  local_60 = p_tile_x0;
  local_58 = p_tile_y0;
  local_50 = p_tile_x1;
  if (OVar11 == 8) {
    pbVar1 = (byte *)((long)&p_j2k->m_specific_param + 0x54);
    if ((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 1) == 0) {
joined_r0x0010cca4:
      while (local_94 == 0xff93) {
LAB_0010cca6:
        OVar12 = opj_stream_get_number_byte_left(p_stream);
        if ((OVar12 == 0) && ((p_j2k->m_specific_param).m_decoder.m_state == 0x40))
        goto LAB_0010d38a;
        if ((*pbVar1 & 4) == 0) {
          uVar9 = p_j2k->m_current_tile_number;
          poVar20 = (p_j2k->m_cp).tcps;
          if ((p_j2k->m_specific_param).m_decoder.m_last_tile_part == 0) {
            uVar16 = (p_j2k->m_specific_param).m_decoder.m_sot_length;
            if (1 < uVar16) goto LAB_0010cefd;
          }
          else {
            OVar12 = opj_stream_get_number_byte_left(p_stream);
            uVar16 = (uint)OVar12;
LAB_0010cefd:
            uVar16 = uVar16 - 2;
            (p_j2k->m_specific_param).m_decoder.m_sot_length = uVar16;
          }
          if (uVar16 != 0) {
            OVar12 = opj_stream_get_number_byte_left(p_stream);
            if (OVar12 < (long)(ulong)uVar16) {
              opj_event_msg(p_manager,2,"Tile part length size inconsistent with stream length\n");
            }
            if (poVar20[uVar9].m_data == (OPJ_BYTE *)0x0) {
              pOVar15 = (OPJ_BYTE *)
                        opj_malloc((ulong)(p_j2k->m_specific_param).m_decoder.m_sot_length);
              poVar20[uVar9].m_data = pOVar15;
              if (pOVar15 == (OPJ_BYTE *)0x0) goto LAB_0010d6bc;
            }
            else {
              pOVar15 = (OPJ_BYTE *)
                        opj_realloc(poVar20[uVar9].m_data,
                                    (ulong)((p_j2k->m_specific_param).m_decoder.m_sot_length +
                                           poVar20[uVar9].m_data_size));
              if (pOVar15 == (OPJ_BYTE *)0x0) {
                opj_free(poVar20[uVar9].m_data);
                poVar20[uVar9].m_data = (OPJ_BYTE *)0x0;
LAB_0010d6bc:
                pcVar19 = "Not enough memory to decode tile\n";
                goto LAB_0010d65b;
              }
              poVar20[uVar9].m_data = pOVar15;
            }
          }
          poVar5 = p_j2k->cstr_index;
          if (poVar5 != (opj_codestream_index_t *)0x0) {
            OVar12 = opj_stream_tell(p_stream);
            uVar21 = p_j2k->m_current_tile_number;
            uVar3 = poVar5->tile_index[uVar21].current_tpsno;
            poVar6 = poVar5->tile_index[uVar21].tp_index;
            poVar6[uVar3].end_header = OVar12 + -2;
            poVar6[uVar3].end_pos = (ulong)(p_j2k->m_specific_param).m_decoder.m_sot_length + OVar12
            ;
            OVar10 = opj_j2k_add_tlmarker
                               (uVar21,poVar5,0xff93,OVar12 + -2,
                                (p_j2k->m_specific_param).m_decoder.m_sot_length + 2);
            if (OVar10 == 0) {
LAB_0010d307:
              pcVar19 = "Not enough memory to add tl marker\n";
              goto LAB_0010d65b;
            }
          }
          OVar14 = (OPJ_SIZE_T)(p_j2k->m_specific_param).m_decoder.m_sot_length;
          if (uVar16 == 0) {
            OVar13 = 0;
          }
          else {
            OVar13 = opj_stream_read_data
                               (p_stream,poVar20[uVar9].m_data + poVar20[uVar9].m_data_size,OVar14,
                                p_manager);
            OVar14 = (OPJ_SIZE_T)(p_j2k->m_specific_param).m_decoder.m_sot_length;
          }
          OVar11 = 0x40;
          if (OVar13 == OVar14) {
            OVar11 = 8;
          }
          (p_j2k->m_specific_param).m_decoder.m_state = OVar11;
          poVar20[uVar9].m_data_size = poVar20[uVar9].m_data_size + (int)OVar13;
          bVar2 = *(byte *)((long)&p_j2k->m_specific_param + 0x54);
          if ((bVar2 & 9) == 1) {
            *(byte *)((long)&p_j2k->m_specific_param + 0x54) = bVar2 | 8;
            local_84 = p_j2k->m_current_tile_number;
            OVar10 = opj_stream_has_seek(p_stream);
            if ((OVar10 != 0) && (OVar12 = opj_stream_tell(p_stream), OVar12 != -1)) {
              do {
                local_48 = OVar12;
                OVar14 = opj_stream_read_data(p_stream,local_3a,2,p_manager);
                bVar24 = true;
                if ((OVar14 != 2) || (opj_read_bytes_LE(local_3a,&local_74,2), local_74 != 0xff90))
                break;
                OVar14 = opj_stream_read_data(p_stream,local_3a,2,p_manager);
                if (OVar14 != 2) {
LAB_0010d37a:
                  pcVar19 = "Stream too short\n";
LAB_0010d680:
                  opj_event_msg(p_manager,1,pcVar19);
                  goto LAB_0010d69c;
                }
                opj_read_bytes_LE(local_3a,&local_88,2);
                if (local_88 != 10) {
                  pcVar19 = "Inconsistent marker size\n";
                  goto LAB_0010d680;
                }
                local_88 = 8;
                OVar14 = opj_stream_read_data(p_stream,local_3a,8,p_manager);
                if (OVar14 != local_88) goto LAB_0010d37a;
                OVar10 = opj_j2k_get_sot_values
                                   (local_3a,local_88,&local_78,&local_8c,&local_7c,&local_80,
                                    p_manager);
                if (OVar10 == 0) goto LAB_0010d69c;
                if (local_78 == local_84) {
                  bVar24 = local_7c != local_80;
                  break;
                }
                if (local_8c < 0xe) break;
                local_8c = local_8c - 0xc;
                uVar22 = opj_stream_skip(p_stream,(ulong)local_8c,p_manager);
                OVar12 = local_48;
              } while (uVar22 == local_8c);
              OVar10 = opj_stream_seek(p_stream,local_48,p_manager);
              if (OVar10 == 0) {
LAB_0010d69c:
                pcVar19 = "opj_j2k_apply_nb_tile_parts_correction error\n";
                goto LAB_0010d65b;
              }
              if (!bVar24) {
                uVar9 = (p_j2k->m_cp).th * (p_j2k->m_cp).tw;
                *(byte *)((long)&p_j2k->m_specific_param + 0x54) =
                     *(byte *)((long)&p_j2k->m_specific_param + 0x54) & 0xee | 0x10;
                if (uVar9 != 0) {
                  poVar20 = (p_j2k->m_cp).tcps;
                  lVar18 = 0;
                  do {
                    iVar4 = *(int *)((long)&poVar20->m_nb_tile_parts + lVar18);
                    if (iVar4 != 0) {
                      *(int *)((long)&poVar20->m_nb_tile_parts + lVar18) = iVar4 + 1;
                    }
                    lVar18 = lVar18 + 0x1640;
                  } while ((ulong)uVar9 * 0x1640 - lVar18 != 0);
                }
                opj_event_msg(p_manager,2,"Non conformant codestream TPsot==TNsot.\n");
              }
            }
          }
          if ((*pbVar1 & 1) == 0) goto LAB_0010d1bb;
        }
        else {
          *(byte *)((long)&p_j2k->m_specific_param + 0x54) = *pbVar1 & 0xfa;
          (p_j2k->m_specific_param).m_decoder.m_state = 8;
LAB_0010d1bb:
          OVar14 = opj_stream_read_data
                             (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager
                             );
          if (OVar14 != 2) goto LAB_0010d2e3;
          opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_94,2);
        }
        if (((*pbVar1 & 1) != 0) || (local_94 == 0xffd9)) goto LAB_0010d38a;
      }
      OVar12 = opj_stream_get_number_byte_left(p_stream);
      if (OVar12 == 0) {
LAB_0010d209:
        (p_j2k->m_specific_param).m_decoder.m_state = 0x40;
        goto LAB_0010cca6;
      }
      OVar14 = opj_stream_read_data
                         (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
      if (OVar14 != 2) goto LAB_0010d2e3;
      opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_90,2);
      if (local_90 < 2) {
        pcVar19 = "Inconsistent marker size\n";
        goto LAB_0010d65b;
      }
      if ((local_94 == 0x8080) && (OVar12 = opj_stream_get_number_byte_left(p_stream), OVar12 == 0))
      goto LAB_0010d209;
      uVar9 = (p_j2k->m_specific_param).m_decoder.m_state;
      if ((uVar9 & 0x10) != 0) {
        (p_j2k->m_specific_param).m_decoder.m_sot_length =
             ((p_j2k->m_specific_param).m_decoder.m_sot_length - local_90) - 2;
      }
      local_90 = local_90 - 2;
      poVar8 = j2k_memory_marker_handler_tab;
      do {
        poVar23 = poVar8;
        OVar11 = poVar23->id;
        if (OVar11 == 0) break;
        poVar8 = poVar23 + 1;
      } while (OVar11 != local_94);
      if ((poVar23->states & uVar9) == 0) {
        pcVar19 = "Marker is not compliant with its position\n";
        goto LAB_0010d65b;
      }
      if ((p_j2k->m_specific_param).m_decoder.m_header_data_size < local_90) {
        uVar22 = (ulong)local_90;
        OVar12 = opj_stream_get_number_byte_left(p_stream);
        if (OVar12 < (long)uVar22) {
          pcVar19 = "Marker size inconsistent with stream length\n";
          goto LAB_0010d65b;
        }
        pOVar15 = (OPJ_BYTE *)
                  opj_realloc((p_j2k->m_specific_param).m_decoder.m_header_data,(ulong)local_90);
        if (pOVar15 == (OPJ_BYTE *)0x0) {
          opj_free((p_j2k->m_specific_param).m_decoder.m_header_data);
          (p_j2k->m_specific_param).m_decoder.m_header_data = (OPJ_BYTE *)0x0;
          (p_j2k->m_specific_param).m_decoder.m_header_data_size = 0;
          pcVar19 = "Not enough memory to read header\n";
          goto LAB_0010d65b;
        }
        (p_j2k->m_specific_param).m_decoder.m_header_data = pOVar15;
        (p_j2k->m_specific_param).m_decoder.m_header_data_size = local_90;
      }
      else {
        pOVar15 = (p_j2k->m_specific_param).m_decoder.m_header_data;
      }
      OVar14 = opj_stream_read_data(p_stream,pOVar15,(ulong)local_90,p_manager);
      if (OVar14 == local_90) {
        if (poVar23->handler ==
            (_func_OPJ_BOOL_opj_j2k_t_ptr_OPJ_BYTE_ptr_OPJ_UINT32_opj_event_mgr_t_ptr *)0x0) {
          pcVar19 = "Not sure how that happened.\n";
          goto LAB_0010d65b;
        }
        OVar10 = (*poVar23->handler)(p_j2k,(p_j2k->m_specific_param).m_decoder.m_header_data,
                                     local_90,p_manager);
        if (OVar10 == 0) {
          opj_event_msg(p_manager,1,"Fail to read the current marker segment (%#x)\n",
                        (ulong)local_94);
          return 0;
        }
        tileno = p_j2k->m_current_tile_number;
        poVar5 = p_j2k->cstr_index;
        OVar12 = opj_stream_tell(p_stream);
        OVar10 = opj_j2k_add_tlmarker
                           (tileno,poVar5,OVar11,(ulong)(((int)OVar12 - local_90) - 4),local_90 + 4)
        ;
        if (OVar10 == 0) goto LAB_0010d307;
        if (OVar11 == 0xff90) {
          OVar12 = opj_stream_tell(p_stream);
          uVar22 = (ulong)(((int)OVar12 - local_90) - 4);
          if ((p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos < (long)uVar22) {
            (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = uVar22;
          }
        }
        if ((*pbVar1 & 4) != 0) {
          uVar22 = opj_stream_skip(p_stream,(ulong)(p_j2k->m_specific_param).m_decoder.m_sot_length,
                                   p_manager);
          if (uVar22 == (p_j2k->m_specific_param).m_decoder.m_sot_length) {
            local_94 = 0xff93;
            goto LAB_0010cca6;
          }
          goto LAB_0010d2e3;
        }
        OVar14 = opj_stream_read_data
                           (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
        if (OVar14 == 2) {
          opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_94,2);
          goto joined_r0x0010cca4;
        }
      }
LAB_0010d2e3:
      pcVar19 = "Stream too short\n";
      goto LAB_0010d65b;
    }
  }
  else {
    if (OVar11 != 0x100) {
      return 0;
    }
    local_94 = 0xffd9;
  }
LAB_0010d3ae:
  if ((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 1) == 0) {
    uVar16 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
    poVar20 = (p_j2k->m_cp).tcps;
    uVar9 = p_j2k->m_current_tile_number;
    uVar22 = (ulong)uVar9;
    if (uVar9 < uVar16) {
      ppOVar17 = &poVar20[uVar22].m_data;
      do {
        uVar9 = (uint)uVar22;
        if (*ppOVar17 != (OPJ_BYTE *)0x0) goto LAB_0010d419;
        uVar9 = uVar9 + 1;
        uVar22 = (ulong)uVar9;
        p_j2k->m_current_tile_number = uVar9;
        ppOVar17 = ppOVar17 + 0x2c8;
      } while (uVar16 != uVar9);
    }
    else {
LAB_0010d419:
      if (uVar9 != uVar16) goto LAB_0010d429;
    }
    *p_go_on = 0;
LAB_0010d619:
    OVar10 = 1;
  }
  else {
    poVar20 = (p_j2k->m_cp).tcps;
    uVar9 = p_j2k->m_current_tile_number;
LAB_0010d429:
    if (poVar20 == (opj_tcp_t *)0x0) {
      __assert_fail("p_tcp != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                    ,0xf1e,"OPJ_BOOL opj_j2k_merge_ppt(opj_tcp_t *, opj_event_mgr_t *)");
    }
    if (poVar20[uVar9].ppt_buffer != (OPJ_BYTE *)0x0) {
      __assert_fail("p_tcp->ppt_buffer == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                    ,0xf20,"OPJ_BOOL opj_j2k_merge_ppt(opj_tcp_t *, opj_event_mgr_t *)");
    }
    if ((poVar20[uVar9].field_0x1638 & 2) == 0) {
LAB_0010d559:
      OVar10 = opj_tcd_init_decode_tile(p_j2k->m_tcd,p_j2k->m_current_tile_number,p_manager);
      if (OVar10 != 0) {
        opj_event_msg(p_manager,4,"Header of tile %d / %d has been read.\n",
                      (ulong)(p_j2k->m_current_tile_number + 1),
                      (ulong)((p_j2k->m_cp).tw * (p_j2k->m_cp).th));
        *local_70 = p_j2k->m_current_tile_number;
        *p_go_on = 1;
        OVar11 = opj_tcd_get_decoded_tile_size(p_j2k->m_tcd);
        *local_68 = OVar11;
        poVar7 = p_j2k->m_tcd->tcd_image->tiles;
        *local_60 = poVar7->x0;
        *local_58 = poVar7->y0;
        *local_50 = poVar7->x1;
        *p_tile_y1 = poVar7->y1;
        *p_nb_comps = poVar7->numcomps;
        *(byte *)&p_j2k->m_specific_param = *(byte *)&p_j2k->m_specific_param | 0x80;
        goto LAB_0010d619;
      }
      pcVar19 = "Cannot decode tile, memory error\n";
    }
    else {
      if ((ulong)poVar20[uVar9].ppt_markers_count == 0) {
        uVar16 = 0;
      }
      else {
        lVar18 = 0;
        uVar16 = 0;
        do {
          uVar16 = uVar16 + *(int *)((long)&(poVar20[uVar9].ppt_markers)->m_data_size + lVar18);
          lVar18 = lVar18 + 0x10;
        } while ((ulong)poVar20[uVar9].ppt_markers_count << 4 != lVar18);
      }
      pOVar15 = (OPJ_BYTE *)opj_malloc((ulong)uVar16);
      poVar20[uVar9].ppt_buffer = pOVar15;
      if (pOVar15 != (OPJ_BYTE *)0x0) {
        poVar20[uVar9].ppt_len = uVar16;
        uVar16 = poVar20[uVar9].ppt_markers_count;
        ptr = poVar20[uVar9].ppt_markers;
        if (uVar16 != 0) {
          uVar22 = 0;
          lVar18 = 8;
          uVar21 = 0;
          do {
            __src = *(void **)((long)ptr + lVar18 + -8);
            if (__src != (void *)0x0) {
              memcpy(poVar20[uVar9].ppt_buffer + uVar21,__src,
                     (ulong)*(uint *)((long)&ptr->m_data + lVar18));
              uVar21 = uVar21 + *(int *)((long)&(poVar20[uVar9].ppt_markers)->m_data + lVar18);
              opj_free(*(void **)((long)poVar20[uVar9].ppt_markers + lVar18 + -8));
              ptr = poVar20[uVar9].ppt_markers;
              *(undefined8 *)((long)ptr + lVar18 + -8) = 0;
              *(undefined4 *)((long)&ptr->m_data + lVar18) = 0;
              uVar16 = poVar20[uVar9].ppt_markers_count;
            }
            uVar22 = uVar22 + 1;
            lVar18 = lVar18 + 0x10;
          } while (uVar22 < uVar16);
        }
        poVar20[uVar9].ppt_markers_count = 0;
        opj_free(ptr);
        poVar20[uVar9].ppt_markers = (opj_ppx *)0x0;
        poVar20[uVar9].ppt_data = poVar20[uVar9].ppt_buffer;
        poVar20[uVar9].ppt_data_size = poVar20[uVar9].ppt_len;
        goto LAB_0010d559;
      }
      opj_event_msg(p_manager,1,"Not enough memory to read PPT marker\n");
      pcVar19 = "Failed to merge PPT data\n";
    }
LAB_0010d65b:
    OVar10 = 0;
    opj_event_msg(p_manager,1,pcVar19);
  }
  return OVar10;
LAB_0010d38a:
  if ((local_94 == 0xffd9) && ((p_j2k->m_specific_param).m_decoder.m_state != 0x100)) {
    p_j2k->m_current_tile_number = 0;
    (p_j2k->m_specific_param).m_decoder.m_state = 0x100;
  }
  goto LAB_0010d3ae;
}

Assistant:

OPJ_BOOL opj_j2k_read_tile_header(      opj_j2k_t * p_j2k,
                                                                    OPJ_UINT32 * p_tile_index,
                                                                    OPJ_UINT32 * p_data_size,
                                                                    OPJ_INT32 * p_tile_x0, OPJ_INT32 * p_tile_y0,
                                                                    OPJ_INT32 * p_tile_x1, OPJ_INT32 * p_tile_y1,
                                                                    OPJ_UINT32 * p_nb_comps,
                                                                    OPJ_BOOL * p_go_on,
                                                                    opj_stream_private_t *p_stream,
                                                                    opj_event_mgr_t * p_manager )
{
        OPJ_UINT32 l_current_marker = J2K_MS_SOT;
        OPJ_UINT32 l_marker_size;
        const opj_dec_memory_marker_handler_t * l_marker_handler = 00;
        opj_tcp_t * l_tcp = NULL;

        /* preconditions */
        assert(p_stream != 00);
        assert(p_j2k != 00);
        assert(p_manager != 00);

        /* Reach the End Of Codestream ?*/
        if (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_EOC){
                l_current_marker = J2K_MS_EOC;
        }
        /* We need to encounter a SOT marker (a new tile-part header) */
        else if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_TPHSOT){
                return OPJ_FALSE;
        }

        /* Read into the codestream until reach the EOC or ! can_decode ??? FIXME */
        while ( (!p_j2k->m_specific_param.m_decoder.m_can_decode) && (l_current_marker != J2K_MS_EOC) ) {

                /* Try to read until the Start Of Data is detected */
                while (l_current_marker != J2K_MS_SOD) {
                    
                    if(opj_stream_get_number_byte_left(p_stream) == 0)
                    {
                        p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_NEOC;
                        break;
                    }

                        /* Try to read 2 bytes (the marker size) from stream and copy them into the buffer */
                        if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                                opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                return OPJ_FALSE;
                        }

                        /* Read 2 bytes from the buffer as the marker size */
                        opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_marker_size,2);

                        /* Check marker size (does not include marker ID but includes marker size) */
                        if (l_marker_size < 2) {
                                opj_event_msg(p_manager, EVT_ERROR, "Inconsistent marker size\n");
                                return OPJ_FALSE;
                        }

                        /* cf. https://code.google.com/p/openjpeg/issues/detail?id=226 */
                        if (l_current_marker == 0x8080 && opj_stream_get_number_byte_left(p_stream) == 0) {
                                p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_NEOC;
                                break;
                        }

                        /* Why this condition? FIXME */
                        if (p_j2k->m_specific_param.m_decoder.m_state & J2K_STATE_TPH){
                                p_j2k->m_specific_param.m_decoder.m_sot_length -= (l_marker_size + 2);
                        }
                        l_marker_size -= 2; /* Subtract the size of the marker ID already read */

                        /* Get the marker handler from the marker ID */
                        l_marker_handler = opj_j2k_get_marker_handler(l_current_marker);

                        /* Check if the marker is known and if it is the right place to find it */
                        if (! (p_j2k->m_specific_param.m_decoder.m_state & l_marker_handler->states) ) {
                                opj_event_msg(p_manager, EVT_ERROR, "Marker is not compliant with its position\n");
                                return OPJ_FALSE;
                        }
/* FIXME manage case of unknown marker as in the main header ? */

                        /* Check if the marker size is compatible with the header data size */
                        if (l_marker_size > p_j2k->m_specific_param.m_decoder.m_header_data_size) {
                                OPJ_BYTE *new_header_data = NULL;
                                /* If we are here, this means we consider this marker as known & we will read it */
                                /* Check enough bytes left in stream before allocation */
                                if ((OPJ_OFF_T)l_marker_size >  opj_stream_get_number_byte_left(p_stream)) {
                                        opj_event_msg(p_manager, EVT_ERROR, "Marker size inconsistent with stream length\n");
                                        return OPJ_FALSE;
                                }
                                new_header_data = (OPJ_BYTE *) opj_realloc(p_j2k->m_specific_param.m_decoder.m_header_data, l_marker_size);
                                if (! new_header_data) {
                                        opj_free(p_j2k->m_specific_param.m_decoder.m_header_data);
                                        p_j2k->m_specific_param.m_decoder.m_header_data = NULL;
                                        p_j2k->m_specific_param.m_decoder.m_header_data_size = 0;
                                        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read header\n");
                                        return OPJ_FALSE;
                                }
                                p_j2k->m_specific_param.m_decoder.m_header_data = new_header_data;
                                p_j2k->m_specific_param.m_decoder.m_header_data_size = l_marker_size;
                        }

                        /* Try to read the rest of the marker segment from stream and copy them into the buffer */
                        if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager) != l_marker_size) {
                                opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                return OPJ_FALSE;
                        }

                        if (!l_marker_handler->handler) {
                                /* See issue #175 */
                                opj_event_msg(p_manager, EVT_ERROR, "Not sure how that happened.\n");
                                return OPJ_FALSE;
                        }
                        /* Read the marker segment with the correct marker handler */
                        if (! (*(l_marker_handler->handler))(p_j2k,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager)) {
                                opj_event_msg(p_manager, EVT_ERROR, "Fail to read the current marker segment (%#x)\n", l_current_marker);
                                return OPJ_FALSE;
                        }

                        /* Add the marker to the codestream index*/
                        if (OPJ_FALSE == opj_j2k_add_tlmarker(p_j2k->m_current_tile_number,
                                                p_j2k->cstr_index,
                                                l_marker_handler->id,
                                                (OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4,
                                                l_marker_size + 4 )) {
                                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to add tl marker\n");
                                return OPJ_FALSE;
                        }

                        /* Keep the position of the last SOT marker read */
                        if ( l_marker_handler->id == J2K_MS_SOT ) {
                                OPJ_UINT32 sot_pos = (OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4 ;
                                if (sot_pos > p_j2k->m_specific_param.m_decoder.m_last_sot_read_pos)
                                {
                                        p_j2k->m_specific_param.m_decoder.m_last_sot_read_pos = sot_pos;
                                }
                        }

                        if (p_j2k->m_specific_param.m_decoder.m_skip_data) {
                                /* Skip the rest of the tile part header*/
                                if (opj_stream_skip(p_stream,p_j2k->m_specific_param.m_decoder.m_sot_length,p_manager) != p_j2k->m_specific_param.m_decoder.m_sot_length) {
                                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                        return OPJ_FALSE;
                                }
                                l_current_marker = J2K_MS_SOD; /* Normally we reached a SOD */
                        }
                        else {
                                /* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer*/
                                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                        return OPJ_FALSE;
                                }
                                /* Read 2 bytes from the buffer as the new marker ID */
                                opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
                        }
                }
                if(opj_stream_get_number_byte_left(p_stream) == 0
                    && p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_NEOC)
                    break;

                /* If we didn't skip data before, we need to read the SOD marker*/
                if (! p_j2k->m_specific_param.m_decoder.m_skip_data) {
                        /* Try to read the SOD marker and skip data ? FIXME */
                        if (! opj_j2k_read_sod(p_j2k, p_stream, p_manager)) {
                                return OPJ_FALSE;
                        }
                        if (p_j2k->m_specific_param.m_decoder.m_can_decode && !p_j2k->m_specific_param.m_decoder.m_nb_tile_parts_correction_checked) {
                                /* Issue 254 */
                                OPJ_BOOL l_correction_needed;
													
                                p_j2k->m_specific_param.m_decoder.m_nb_tile_parts_correction_checked = 1;
                                if(!opj_j2k_need_nb_tile_parts_correction(p_stream, p_j2k->m_current_tile_number, &l_correction_needed, p_manager)) {
                                        opj_event_msg(p_manager, EVT_ERROR, "opj_j2k_apply_nb_tile_parts_correction error\n");
                                        return OPJ_FALSE;
                                }
                                if (l_correction_needed) {
                                        OPJ_UINT32 l_nb_tiles = p_j2k->m_cp.tw * p_j2k->m_cp.th;
                                        OPJ_UINT32 l_tile_no;

                                        p_j2k->m_specific_param.m_decoder.m_can_decode = 0;
                                        p_j2k->m_specific_param.m_decoder.m_nb_tile_parts_correction = 1;
                                        /* correct tiles */
                                        for (l_tile_no = 0U; l_tile_no < l_nb_tiles; ++l_tile_no) {
                                                if (p_j2k->m_cp.tcps[l_tile_no].m_nb_tile_parts != 0U) {
                                                        p_j2k->m_cp.tcps[l_tile_no].m_nb_tile_parts+=1;
                                                }
                                        }
                                        opj_event_msg(p_manager, EVT_WARNING, "Non conformant codestream TPsot==TNsot.\n");
                                }
                        }
                        if (! p_j2k->m_specific_param.m_decoder.m_can_decode){
                                /* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
                                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                        return OPJ_FALSE;
                                }

                                /* Read 2 bytes from buffer as the new marker ID */
                                opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
                        }
                }
                else {
                        /* Indicate we will try to read a new tile-part header*/
                        p_j2k->m_specific_param.m_decoder.m_skip_data = 0;
                        p_j2k->m_specific_param.m_decoder.m_can_decode = 0;
                        p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_TPHSOT;

                        /* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
                        if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                                opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                return OPJ_FALSE;
                        }

                        /* Read 2 bytes from buffer as the new marker ID */
                        opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
                }
        }

        /* Current marker is the EOC marker ?*/
        if (l_current_marker == J2K_MS_EOC) {
                if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_EOC ){
                        p_j2k->m_current_tile_number = 0;
                        p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_EOC;
                }
        }

        /* FIXME DOC ???*/
        if ( ! p_j2k->m_specific_param.m_decoder.m_can_decode) {
                OPJ_UINT32 l_nb_tiles = p_j2k->m_cp.th * p_j2k->m_cp.tw;
                l_tcp = p_j2k->m_cp.tcps + p_j2k->m_current_tile_number;

                while( (p_j2k->m_current_tile_number < l_nb_tiles) && (l_tcp->m_data == 00) ) {
                        ++p_j2k->m_current_tile_number;
                        ++l_tcp;
                }

                if (p_j2k->m_current_tile_number == l_nb_tiles) {
                        *p_go_on = OPJ_FALSE;
                        return OPJ_TRUE;
                }
        }

        if (! opj_j2k_merge_ppt(p_j2k->m_cp.tcps + p_j2k->m_current_tile_number, p_manager)) {
                opj_event_msg(p_manager, EVT_ERROR, "Failed to merge PPT data\n");
                return OPJ_FALSE;
        }
        /*FIXME ???*/
        if (! opj_tcd_init_decode_tile(p_j2k->m_tcd, p_j2k->m_current_tile_number, p_manager)) {
                opj_event_msg(p_manager, EVT_ERROR, "Cannot decode tile, memory error\n");
                return OPJ_FALSE;
        }

        opj_event_msg(p_manager, EVT_INFO, "Header of tile %d / %d has been read.\n",
                        p_j2k->m_current_tile_number+1, (p_j2k->m_cp.th * p_j2k->m_cp.tw));

        *p_tile_index = p_j2k->m_current_tile_number;
        *p_go_on = OPJ_TRUE;
        *p_data_size = opj_tcd_get_decoded_tile_size(p_j2k->m_tcd);
        *p_tile_x0 = p_j2k->m_tcd->tcd_image->tiles->x0;
        *p_tile_y0 = p_j2k->m_tcd->tcd_image->tiles->y0;
        *p_tile_x1 = p_j2k->m_tcd->tcd_image->tiles->x1;
        *p_tile_y1 = p_j2k->m_tcd->tcd_image->tiles->y1;
        *p_nb_comps = p_j2k->m_tcd->tcd_image->tiles->numcomps;

         p_j2k->m_specific_param.m_decoder.m_state |= 0x0080;/* FIXME J2K_DEC_STATE_DATA;*/

        return OPJ_TRUE;
}